

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

ssize_t __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::send
          (WebSocketPipeImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  WebSocket *pWVar1;
  undefined4 in_register_00000034;
  OneOf<kj::ArrayPtr<const_char>,_kj::ArrayPtr<const_unsigned_char>,_kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>
  local_28;
  
  pWVar1 = (((WebSocketPipeImpl *)CONCAT44(in_register_00000034,__fd))->state).ptr;
  if (pWVar1 == (WebSocket *)0x0) {
    local_28.tag = 1;
    local_28.field_1.forceAligned = __buf;
    local_28.field_1._8_8_ = __n;
    newAdaptedPromise<void,kj::(anonymous_namespace)::WebSocketPipeImpl::BlockedSend,kj::(anonymous_namespace)::WebSocketPipeImpl&,kj::OneOf<kj::ArrayPtr<char_const>,kj::ArrayPtr<unsigned_char_const>,kj::(anonymous_namespace)::WebSocketPipeImpl::ClosePtr>>
              ((kj *)this,(WebSocketPipeImpl *)CONCAT44(in_register_00000034,__fd),&local_28);
  }
  else {
    (*pWVar1->_vptr_WebSocket[1])(this,pWVar1);
  }
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const char> message) override {
    KJ_IF_MAYBE(s, state) {
      return s->send(message);
    } else {
      return newAdaptedPromise<void, BlockedSend>(*this, MessagePtr(message));
    }
  }